

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_get_proc_grid(Integer g_a,Integer *dims)

{
  short sVar1;
  global_array_t *pgVar2;
  long lVar3;
  char err_string [256];
  char acStack_128 [256];
  
  lVar3 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar3)) {
    sprintf(acStack_128,"%s: INVALID ARRAY HANDLE","ga_get_proc_grid");
    pnga_error(acStack_128,g_a);
  }
  if (GA[lVar3].actv == 0) {
    sprintf(acStack_128,"%s: ARRAY NOT ACTIVE","ga_get_proc_grid");
    pnga_error(acStack_128,g_a);
  }
  pgVar2 = GA;
  sVar1 = GA[lVar3].ndim;
  if (0 < (long)sVar1) {
    lVar3 = 0;
    do {
      dims[lVar3] = (long)pgVar2[g_a + 1000].nblock[lVar3];
      lVar3 = lVar3 + 1;
    } while (sVar1 != lVar3);
  }
  return;
}

Assistant:

void pnga_get_proc_grid(Integer g_a, Integer *dims)
{
  Integer i, ndim, ga_handle = GA_OFFSET + g_a;
  ga_check_handleM(g_a, "ga_get_proc_grid");
  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) {
    dims[i] = GA[ga_handle].nblock[i];
  }
}